

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_paramSwitch_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  int iVar2;
  ZSTD_cwksp *ws_00;
  ZSTD_cwksp *ws_01;
  void *pvVar3;
  int in_ECX;
  uint *in_RDX;
  ZSTD_cwksp *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  U32 rowLog;
  size_t tagTableSize;
  size_t h3Size;
  U32 hashLog3;
  size_t hSize;
  size_t chainSize;
  U32 in_stack_ffffffffffffff6c;
  ZSTD_paramSwitch_e in_stack_ffffffffffffff70;
  ZSTD_strategy in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint uVar4;
  uint in_stack_ffffffffffffff8c;
  uint uVar5;
  size_t local_8;
  
  iVar2 = ZSTD_allocateChainTable
                    (in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (iVar2 == 0) {
    ws_00 = (ZSTD_cwksp *)0x0;
  }
  else {
    ws_00 = (ZSTD_cwksp *)(1L << ((byte)in_RDX[1] & 0x3f));
  }
  uVar1 = in_RDX[2];
  if ((in_stack_00000008 == 1) && (in_RDX[4] == 3)) {
    if (*in_RDX < 0x12) {
      uVar5 = *in_RDX;
      in_stack_ffffffffffffff8c = uVar5;
    }
    else {
      uVar5 = 0x11;
      in_stack_ffffffffffffff8c = uVar5;
    }
  }
  else {
    uVar5 = 0;
  }
  if (uVar5 == 0) {
    ws_01 = (ZSTD_cwksp *)0x0;
  }
  else {
    ws_01 = (ZSTD_cwksp *)(1L << ((byte)uVar5 & 0x3f));
  }
  if (in_ECX == 0) {
    __assert_fail("useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5854,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  uVar4 = uVar5;
  if (in_R9D == 1) {
    ZSTD_window_init((ZSTD_window_t *)0x2bc927);
    ZSTD_cwksp_mark_tables_dirty((ZSTD_cwksp *)0x2bc934);
  }
  *(uint *)(in_RDI + 0x30) = uVar5;
  *(undefined4 *)(in_RDI + 300) = 0;
  ZSTD_invalidateMatchState((ZSTD_matchState_t *)0x2bc962);
  iVar2 = ZSTD_cwksp_reserve_failed(in_RSI);
  if (iVar2 != 0) {
    __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x585f,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ZSTD_cwksp_clear_tables((ZSTD_cwksp *)0x2bc9a2);
  pvVar3 = ZSTD_cwksp_reserve_table
                     ((ZSTD_cwksp *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),(size_t)ws_01);
  *(void **)(in_RDI + 0x70) = pvVar3;
  pvVar3 = ZSTD_cwksp_reserve_table
                     ((ZSTD_cwksp *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),(size_t)ws_01);
  *(void **)(in_RDI + 0x80) = pvVar3;
  pvVar3 = ZSTD_cwksp_reserve_table
                     ((ZSTD_cwksp *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),(size_t)ws_01);
  *(void **)(in_RDI + 0x78) = pvVar3;
  iVar2 = ZSTD_cwksp_reserve_failed(in_RSI);
  if (iVar2 == 0) {
    if (in_R8D != 1) {
      ZSTD_cwksp_clean_tables((ZSTD_cwksp *)0x2bca4b);
    }
    iVar2 = ZSTD_rowMatchFinderUsed(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
    if (iVar2 != 0) {
      if (in_stack_00000008 == 1) {
        pvVar3 = ZSTD_cwksp_reserve_aligned_init_once
                           (ws_00,CONCAT44(in_stack_ffffffffffffff8c,uVar4));
        *(void **)(in_RDI + 0x38) = pvVar3;
        ZSTD_advanceHashSalt
                  ((ZSTD_matchState_t *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      }
      else {
        pvVar3 = ZSTD_cwksp_reserve_aligned
                           (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        *(void **)(in_RDI + 0x38) = pvVar3;
        memset(*(void **)(in_RDI + 0x38),0,1L << ((byte)uVar1 & 0x3f));
        *(undefined8 *)(in_RDI + 0x60) = 0;
      }
      if (in_RDX[3] < 6) {
        in_stack_ffffffffffffff7c = in_RDX[3];
      }
      else {
        in_stack_ffffffffffffff7c = 6;
      }
      if (in_stack_ffffffffffffff7c < 4) {
        in_stack_ffffffffffffff78 = 4;
      }
      else if (in_RDX[3] < 6) {
        in_stack_ffffffffffffff78 = in_RDX[3];
      }
      else {
        in_stack_ffffffffffffff78 = 6;
      }
      if (in_RDX[2] < in_stack_ffffffffffffff78) {
        __assert_fail("cParams->hashLog >= rowLog",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5881,
                      "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                     );
      }
      *(uint *)(in_RDI + 0x34) = in_RDX[2] - in_stack_ffffffffffffff78;
    }
    if ((in_stack_00000008 == 1) && (6 < in_RDX[6])) {
      pvVar3 = ZSTD_cwksp_reserve_aligned
                         (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(void **)(in_RDI + 0x90) = pvVar3;
      pvVar3 = ZSTD_cwksp_reserve_aligned
                         (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(void **)(in_RDI + 0x98) = pvVar3;
      pvVar3 = ZSTD_cwksp_reserve_aligned
                         (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(void **)(in_RDI + 0xa0) = pvVar3;
      pvVar3 = ZSTD_cwksp_reserve_aligned
                         (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(void **)(in_RDI + 0xa8) = pvVar3;
      pvVar3 = ZSTD_cwksp_reserve_aligned
                         (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(void **)(in_RDI + 0xb0) = pvVar3;
      pvVar3 = ZSTD_cwksp_reserve_aligned
                         (ws_01,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *(void **)(in_RDI + 0xb8) = pvVar3;
    }
    *(undefined8 *)(in_RDI + 0x100) = *(undefined8 *)in_RDX;
    *(undefined8 *)(in_RDI + 0x108) = *(undefined8 *)(in_RDX + 2);
    *(undefined8 *)(in_RDI + 0x110) = *(undefined8 *)(in_RDX + 4);
    *(uint *)(in_RDI + 0x118) = in_RDX[6];
    iVar2 = ZSTD_cwksp_reserve_failed(in_RSI);
    if (iVar2 == 0) {
      local_8 = 0;
    }
    else {
      local_8 = 0xffffffffffffffc0;
    }
  }
  else {
    local_8 = 0xffffffffffffffc0;
  }
  return local_8;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_paramSwitch_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_ps_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;
    ms->lazySkipping = 0;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        /* Row match finder needs an additional table of hashes ("tags") */
        size_t const tagTableSize = hSize;
        /* We want to generate a new salt in case we reset a Cctx, but we always want to use
         * 0 when we reset a Cdict */
        if(forWho == ZSTD_resetTarget_CCtx) {
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned_init_once(ws, tagTableSize);
            ZSTD_advanceHashSalt(ms);
        } else {
            /* When we are not salting we want to always memset the memory */
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            ZSTD_memset(ms->tagTable, 0, tagTableSize);
            ms->hashSalt = 0;
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = BOUNDED(4, cParams->searchLog, 6);
            assert(cParams->hashLog >= rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}